

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O1

int ParseHex(char *hex)

{
  char cVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  
  cVar1 = *hex;
  if (cVar1 == '\0') {
    iVar4 = 0;
  }
  else {
    pcVar2 = hex + 1;
    iVar4 = 0;
    do {
      cVar3 = -0x30;
      if (((9 < (byte)(cVar1 - 0x30U)) && (cVar3 = -0x57, 5 < (byte)(cVar1 + 0x9fU))) &&
         (cVar3 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) {
        Printf("Bad hex number: %s\n",hex);
        return 0;
      }
      iVar4 = iVar4 * 0x10 + (uint)(byte)(cVar1 + cVar3);
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  return iVar4;
}

Assistant:

int ParseHex (const char *hex)
{
	const char *str;
	int num;

	num = 0;
	str = hex;

	while (*str)
	{
		num <<= 4;
		if (*str >= '0' && *str <= '9')
			num += *str-'0';
		else if (*str >= 'a' && *str <= 'f')
			num += 10 + *str-'a';
		else if (*str >= 'A' && *str <= 'F')
			num += 10 + *str-'A';
		else {
			Printf ("Bad hex number: %s\n",hex);
			return 0;
		}
		str++;
	}

	return num;
}